

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

int __thiscall
QDockAreaLayoutInfo::separatorMove
          (QDockAreaLayoutInfo *this,QList<int> *separator,QPoint *origin,QPoint *dest)

{
  int iVar1;
  QDockAreaLayoutInfo *this_00;
  int delta;
  
  iVar1 = (separator->d).ptr[(separator->d).size + -1];
  this_00 = info(this,separator);
  delta = (dest->yp).m_i - (origin->yp).m_i;
  if (this_00->o == Horizontal) {
    delta = (dest->xp).m_i - (origin->xp).m_i;
  }
  if (delta == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = separatorMove(this_00,iVar1,delta);
  }
  apply(this_00,false);
  return iVar1;
}

Assistant:

int QDockAreaLayoutInfo::separatorMove(const QList<int> &separator, const QPoint &origin,
                                       const QPoint &dest)
{
    int delta = 0;
    int index = separator.last();
    QDockAreaLayoutInfo *info = this->info(separator);
    delta = pick(info->o, dest - origin);
    if (delta != 0)
        delta = info->separatorMove(index, delta);
    info->apply(false);
    return delta;
}